

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

string * __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::GetDictNum_abi_cxx11_
          (string *__return_storage_ptr__,DictionaryPrinter *this,size_t index,size_t size)

{
  allocator local_59;
  char buf [64];
  
  snprintf(buf,0x40,"%lu of %lu",index,size);
  std::__cxx11::string::string((string *)__return_storage_ptr__,buf,&local_59);
  return __return_storage_ptr__;
}

Assistant:

string GetDictNum(size_t index, size_t size) const {
    char buf[64];   // big enough for two ints
    snprintf(buf, sizeof(buf), "%" PRIuS " of %" PRIuS, index, size);
    return buf;
  }